

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

int LogLuvDecode24(TIFF *tif,uint8_t *op,tmsize_t occ,uint16_t s)

{
  uint8_t *puVar1;
  long lVar2;
  uint8_t *local_60;
  uint32_t *tp;
  uchar *bp;
  tmsize_t npixels;
  tmsize_t i;
  tmsize_t cc;
  LogLuvState *sp;
  uint16_t s_local;
  tmsize_t occ_local;
  uint8_t *op_local;
  TIFF *tif_local;
  
  puVar1 = tif->tif_data;
  if (s != 0) {
    __assert_fail("s == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x10e,"int LogLuvDecode24(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  if (puVar1 != (uint8_t *)0x0) {
    lVar2 = occ / (long)*(int *)(puVar1 + 0xc);
    local_60 = op;
    if (*(int *)(puVar1 + 4) != 2) {
      if (*(long *)(puVar1 + 0x18) < lVar2) {
        TIFFErrorExtR(tif,"LogLuvDecode24","Translation buffer too short");
        return 0;
      }
      local_60 = *(uint8_t **)(puVar1 + 0x10);
    }
    tp = (uint32_t *)tif->tif_rawcp;
    i = tif->tif_rawcc;
    for (npixels = 0; npixels < lVar2 && 2 < i; npixels = npixels + 1) {
      *(uint *)(local_60 + npixels * 4) =
           (uint)(byte)*tp << 0x10 | (uint)*(byte *)((long)tp + 1) << 8 |
           (uint)*(byte *)((long)tp + 2);
      tp = (uint32_t *)((long)tp + 3);
      i = i + -3;
    }
    tif->tif_rawcp = (uint8_t *)tp;
    tif->tif_rawcc = i;
    if (npixels == lVar2) {
      (**(code **)(puVar1 + 0x20))(puVar1,op,lVar2);
    }
    else {
      TIFFErrorExtR(tif,"LogLuvDecode24","Not enough data at row %u (short %ld pixels)",
                    (ulong)tif->tif_row,lVar2 - npixels);
    }
    tif_local._4_4_ = (uint)(npixels == lVar2);
    return tif_local._4_4_;
  }
  __assert_fail("sp != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                ,0x10f,"int LogLuvDecode24(TIFF *, uint8_t *, tmsize_t, uint16_t)");
}

Assistant:

static int LogLuvDecode24(TIFF *tif, uint8_t *op, tmsize_t occ, uint16_t s)
{
    static const char module[] = "LogLuvDecode24";
    LogLuvState *sp = DecoderState(tif);
    tmsize_t cc;
    tmsize_t i;
    tmsize_t npixels;
    unsigned char *bp;
    uint32_t *tp;

    (void)s;
    assert(s == 0);
    assert(sp != NULL);

    npixels = occ / sp->pixel_size;

    if (sp->user_datafmt == SGILOGDATAFMT_RAW)
        tp = (uint32_t *)op;
    else
    {
        if (sp->tbuflen < npixels)
        {
            TIFFErrorExtR(tif, module, "Translation buffer too short");
            return (0);
        }
        tp = (uint32_t *)sp->tbuf;
    }
    /* copy to array of uint32_t */
    bp = (unsigned char *)tif->tif_rawcp;
    cc = tif->tif_rawcc;
    for (i = 0; i < npixels && cc >= 3; i++)
    {
        tp[i] = bp[0] << 16 | bp[1] << 8 | bp[2];
        bp += 3;
        cc -= 3;
    }
    tif->tif_rawcp = (uint8_t *)bp;
    tif->tif_rawcc = cc;
    if (i != npixels)
    {
        TIFFErrorExtR(tif, module,
                      "Not enough data at row %" PRIu32
                      " (short %" TIFF_SSIZE_FORMAT " pixels)",
                      tif->tif_row, npixels - i);
        return (0);
    }
    (*sp->tfunc)(sp, op, npixels);
    return (1);
}